

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio.c
# Opt level: O0

uint32_t FAudioVoice_SetVolume(FAudioVoice *voice,float Volume,uint32_t OperationSet)

{
  int in_ESI;
  FAudioVoice *in_RDI;
  float in_XMM0_Da;
  uint32_t i;
  uint32_t in_stack_ffffffffffffffd8;
  float in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  uint sendIndex;
  
  if ((in_ESI == 0) || (in_RDI->audio->active == '\0')) {
    FAudio_PlatformLockMutex((FAudioMutex)0x12817d);
    FAudio_PlatformLockMutex((FAudioMutex)0x12818e);
    if (in_XMM0_Da <= 16777216.0) {
      if (in_XMM0_Da < -16777216.0) {
        in_XMM0_Da = -16777216.0;
      }
    }
    else {
      in_XMM0_Da = 16777216.0;
    }
    in_RDI->volume = in_XMM0_Da;
    for (sendIndex = 0; sendIndex < (in_RDI->sends).SendCount; sendIndex = sendIndex + 1) {
      FAudio_RecalcMixMatrix(in_RDI,sendIndex);
    }
    FAudio_PlatformUnlockMutex((FAudioMutex)0x12823d);
    FAudio_PlatformUnlockMutex((FAudioMutex)0x12824e);
  }
  else {
    FAudio_OPERATIONSET_QueueSetVolume
              ((FAudioVoice *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
               in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
  }
  return 0;
}

Assistant:

uint32_t FAudioVoice_SetVolume(
	FAudioVoice *voice,
	float Volume,
	uint32_t OperationSet
) {
	uint32_t i;

	LOG_API_ENTER(voice->audio)

	if (OperationSet != FAUDIO_COMMIT_NOW && voice->audio->active)
	{
		FAudio_OPERATIONSET_QueueSetVolume(
			voice,
			Volume,
			OperationSet
		);
		LOG_API_EXIT(voice->audio)
		return 0;
	}

	FAudio_PlatformLockMutex(voice->sendLock);
	LOG_MUTEX_LOCK(voice->audio, voice->sendLock)

	FAudio_PlatformLockMutex(voice->volumeLock);
	LOG_MUTEX_LOCK(voice->audio, voice->volumeLock)

	voice->volume = FAudio_clamp(
		Volume,
		-FAUDIO_MAX_VOLUME_LEVEL,
		FAUDIO_MAX_VOLUME_LEVEL
	);

	for (i = 0; i < voice->sends.SendCount; i += 1)
	{
		FAudio_RecalcMixMatrix(voice, i);
	}

	FAudio_PlatformUnlockMutex(voice->volumeLock);
	LOG_MUTEX_UNLOCK(voice->audio, voice->volumeLock)

	FAudio_PlatformUnlockMutex(voice->sendLock);
	LOG_MUTEX_UNLOCK(voice->audio, voice->sendLock)

	LOG_API_EXIT(voice->audio)
	return 0;
}